

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_boolean_t is_arduino_board(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  uint *puVar3;
  size_t sVar4;
  FILE *fp;
  int errno_saved;
  int ret;
  int i;
  char format_str [64];
  int gpiochip_idx [4];
  char gpiochip_label_arduino [10];
  char gpiochip_label [64];
  char gpiochip_path [64];
  mraa_boolean_t local_c;
  
  stack0xffffffffffffff5e = 0x353535396c616370;
  gpiochip_label_arduino[0] = 'a';
  gpiochip_label_arduino[1] = '\0';
  format_str[0x38] = -0x38;
  format_str[0x39] = '\0';
  format_str[0x3a] = '\0';
  format_str[0x3b] = '\0';
  format_str[0x3c] = -0x28;
  format_str[0x3d] = '\0';
  format_str[0x3e] = '\0';
  format_str[0x3f] = '\0';
  gpiochip_idx[0] = 0xe8;
  gpiochip_idx[1] = 0xf8;
  snprintf((char *)&ret,0x40,"%%%ds",0x3f);
  tristate = mraa_gpio_init_raw(0xd6);
  if (tristate == (mraa_gpio_context)0x0) {
    syslog(6,"edison: tristate not detected");
    local_c = 0;
  }
  else {
    for (errno_saved = 0; (uint)errno_saved < 4; errno_saved = errno_saved + 1) {
      memset(gpiochip_label + 0x38,0,0x40);
      snprintf(gpiochip_label + 0x38,0x40,"/sys/class/gpio/gpiochip%d/label",
               (ulong)(uint)gpiochip_idx[(long)errno_saved + -2]);
      __stream = fopen(gpiochip_label + 0x38,"r");
      if (__stream == (FILE *)0x0) {
        puVar3 = (uint *)__errno_location();
        syslog(6,"edison: could not open \'%s\', errno %d",gpiochip_label + 0x38,(ulong)*puVar3);
        return 0;
      }
      memset(gpiochip_label_arduino + 2,0,0x40);
      iVar2 = __isoc99_fscanf(__stream,&ret,gpiochip_label_arduino + 2);
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      fclose(__stream);
      if (iVar2 != 1) {
        syslog(6,"edison: could not read from \'%s\', errno %d",gpiochip_label + 0x38,(ulong)uVar1);
        return 0;
      }
      sVar4 = strlen(gpiochip_label_arduino + 2);
      iVar2 = strncmp(gpiochip_label_arduino + 2,(char *)((long)gpiochip_idx + 0xe),sVar4 + 1);
      if (iVar2 != 0) {
        syslog(6,"edison: gpiochip label (%s) is not what we expect (%s)\n",
               gpiochip_label_arduino + 2,(long)gpiochip_idx + 0xe);
        return 0;
      }
    }
    syslog(5,"edison: Arduino board detected");
    local_c = 1;
  }
  return local_c;
}

Assistant:

mraa_boolean_t
is_arduino_board()
{
    // We check for two things to determine if that's an Arduino expansion board
    // 1) is tristate GPIO available, by trying to initialize it
    // 2) are there four specific GPIO expanders, by reading device labels
    //        /sys/class/gpio/gpiochip{200,216,232,248}/label == "pcal9555a"
    char gpiochip_path[MAX_SIZE];
    char gpiochip_label[MAX_SIZE];
    const char gpiochip_label_arduino[] = "pcal9555a";
    const int gpiochip_idx[4] = { 200, 216, 232, 248 };

    // prepare format string for fscanf, based on MAX_SIZE
    char format_str[MAX_SIZE];
    snprintf(format_str, MAX_SIZE, "%%%ds", MAX_SIZE - 1);
    int i, ret, errno_saved;

    // check tristate first
    tristate = mraa_gpio_init_raw(214);
    if (tristate == NULL) {
        syslog(LOG_INFO, "edison: tristate not detected");
        return 0;
    }

    // GPIO expanders second
    for (i=0; i<(sizeof(gpiochip_idx)/sizeof(gpiochip_idx[0])); i++) {
        memset(gpiochip_path, 0, MAX_SIZE);
        snprintf(gpiochip_path,
                 MAX_SIZE,
                 SYSFS_CLASS_GPIO "/gpiochip%d/label",
                 gpiochip_idx[i]);
        FILE *fp;
        fp = fopen(gpiochip_path, "r");
        if (fp == NULL) {
            syslog(LOG_INFO,
                   "edison: could not open '%s', errno %d",
                   gpiochip_path,
                   errno);
            return 0;
        }

        memset(gpiochip_label, 0, MAX_SIZE);
        ret = fscanf(fp, format_str, &gpiochip_label);
        errno_saved = errno;
        fclose(fp);
        if (ret != 1) {
            syslog(LOG_INFO,
                   "edison: could not read from '%s', errno %d",
                   gpiochip_path,
                   errno_saved);
            return 0;
        }

        // we want to check for exact match
        if (strncmp(gpiochip_label, gpiochip_label_arduino, strlen(gpiochip_label) + 1) != 0) {
            syslog(LOG_INFO,
                   "edison: gpiochip label (%s) is not what we expect (%s)\n",
                   gpiochip_label,
                   gpiochip_label_arduino);
            return 0;
        }
    }

    syslog(LOG_NOTICE, "edison: Arduino board detected");
    return 1;
}